

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O2

void VP8Clear(VP8Decoder *dec)

{
  WebPWorkerInterface *pWVar1;
  
  if (dec != (VP8Decoder *)0x0) {
    pWVar1 = WebPGetWorkerInterface();
    (*pWVar1->End)(&dec->worker);
    WebPDeallocateAlphaMemory(dec);
    WebPSafeFree(dec->mem);
    (dec->br).buf_max = (uint8_t *)0x0;
    *(undefined8 *)&(dec->br).eof = 0;
    (dec->br).buf = (uint8_t *)0x0;
    (dec->br).buf_end = (uint8_t *)0x0;
    (dec->br).value = 0;
    (dec->br).range = 0;
    (dec->br).bits = 0;
    dec->ready = 0;
    dec->mem = (void *)0x0;
    dec->mem_size = 0;
  }
  return;
}

Assistant:

void VP8Clear(VP8Decoder* const dec) {
  if (dec == NULL) {
    return;
  }
  WebPGetWorkerInterface()->End(&dec->worker);
  WebPDeallocateAlphaMemory(dec);
  WebPSafeFree(dec->mem);
  dec->mem = NULL;
  dec->mem_size = 0;
  memset(&dec->br, 0, sizeof(dec->br));
  dec->ready = 0;
}